

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastUR1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  uchar uVar1;
  SerialArena *this;
  __int_type_conflict2 _Var2;
  bool bVar3;
  uint32_t size;
  uint uVar4;
  RepeatedPtrFieldBase *this_00;
  string *s;
  ushort *puVar5;
  ulong uVar6;
  char *pcVar7;
  uint *puVar8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 s_00;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *extraout_RDX_01;
  ParseContext *extraout_RDX_02;
  ParseContext *extraout_RDX_03;
  ParseContext *ctx_00;
  size_t offset;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 ptr_00;
  long in_FS_OFFSET;
  anon_class_24_3_e6152a34 validate_last_string;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_50;
  anon_class_24_3_e6152a34 local_48;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar7 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar7;
  }
  uVar1 = *ptr;
  s_00 = data.field_0 >> 0x30;
  ptr_00.data = s_00.data;
  this_00 = &RefAt<google::protobuf::RepeatedPtrField<std::__cxx11::string>>(msg,s_00.data)->
             super_RepeatedPtrFieldBase;
  local_48.expected_tag = uVar1;
  local_48.table = table;
  local_48.field =
       (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)this_00;
  if ((this_00->arena_ != (Arena *)0x0) &&
     (s_00.data = 0xffffffffffffff80,
     *(uint64_t *)(in_FS_OFFSET + -0x78) == (this_00->arena_->impl_).tag_and_id_)) {
    this = *(SerialArena **)(in_FS_OFFSET + -0x70);
    bVar3 = RepeatedPtrFieldBase::PrepareForParse(this_00);
    if (bVar3) {
      do {
        local_50.data = (long)ptr + 1;
        size = ReadSize((char **)&local_50);
        ctx_00 = extraout_RDX;
        if ((string *)local_50.data == (string *)0x0) goto LAB_001ccde0;
        _Var2 = (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i;
        if (_Var2 == 0) {
          s_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 SerialArena::AllocateFromStringBlockFallback(this);
        }
        else {
          offset = _Var2 - 0x20;
          (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i = offset;
          s_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 StringBlock::AtOffset_abi_cxx11_((this->string_block_)._M_b._M_p,offset);
        }
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)s_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(s_00.data + 0x10);
        *(size_type *)(s_00.data + 8) = 0;
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(s_00.data + 0x10))->_M_local_buf[0] = '\0';
        RepeatedPtrFieldBase::AddAllocatedForParse(this_00,(void *)s_00);
        ptr_00 = local_50;
        ptr = EpsCopyInputStream::ReadString
                        (&ctx->super_EpsCopyInputStream,(char *)local_50,size,(string *)s_00);
        ctx_00 = extraout_RDX_00;
        if (((ushort *)ptr == (ushort *)0x0) ||
           (bVar3 = RepeatedString<unsigned_char,_google::protobuf::RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(google::protobuf::internal::TcParser::Utf8Type)1>
                    ::anon_class_24_3_e6152a34::operator()(&local_48), ctx_00 = extraout_RDX_01,
           !bVar3)) goto LAB_001ccde0;
        puVar5 = (ushort *)(ctx->super_EpsCopyInputStream).limit_end_;
        if (puVar5 <= ptr) goto LAB_001ccdae;
      } while ((uchar)*(ushort *)ptr == uVar1);
      goto LAB_001ccd64;
    }
  }
  do {
    ptr_00.data = (long)ptr + 1;
    s = (string *)RepeatedPtrFieldBase::AddString(this_00);
    ptr = InlineGreedyStringParser(s,(char *)ptr_00,ctx);
    ctx_00 = extraout_RDX_02;
    if (((ushort *)ptr == (ushort *)0x0) ||
       (bVar3 = RepeatedString<unsigned_char,_google::protobuf::RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(google::protobuf::internal::TcParser::Utf8Type)1>
                ::anon_class_24_3_e6152a34::operator()(&local_48), ctx_00 = extraout_RDX_03, !bVar3)
       ) {
LAB_001ccde0:
      pcVar7 = Error(msg,(char *)ptr_00,ctx_00,(TcFieldData)s_00,table,hasbits);
      return pcVar7;
    }
    puVar5 = (ushort *)(ctx->super_EpsCopyInputStream).limit_end_;
    if (puVar5 <= ptr) goto LAB_001ccdae;
  } while ((uchar)*(ushort *)ptr == uVar1);
LAB_001ccd64:
  if (ptr < puVar5) {
    uVar4 = (uint)table->fast_idx_mask & (uint)*(ushort *)ptr;
    if ((uVar4 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar6 = (ulong)(uVar4 & 0xfffffff8);
    pcVar7 = (char *)(**(code **)(&table[1].has_bits_offset + uVar6))
                               (msg,ptr,ctx,
                                (ulong)*(ushort *)ptr ^
                                *(ulong *)(&table[1].fast_idx_mask + uVar6 * 2),table,hasbits);
    return pcVar7;
  }
LAB_001ccdae:
  if (table->has_bits_offset != 0) {
    puVar8 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
    *puVar8 = *puVar8 | (uint)hasbits;
  }
  return (char *)(ushort *)ptr;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastUR1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedString<uint8_t,
                                          RepeatedPtrField<std::string>, kUtf8>(
      PROTOBUF_TC_PARAM_PASS);
}